

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

xmlCharEncodingHandlerPtr
xmlNewCharEncodingHandler
          (char *name,xmlCharEncodingInputFunc input,xmlCharEncodingOutputFunc output)

{
  __int32_t _Var1;
  char *pcVar2;
  __int32_t **pp_Var3;
  xmlCharEncodingHandlerPtr handler;
  ulong uVar4;
  char upper [500];
  char local_218 [504];
  
  pcVar2 = xmlGetEncodingAlias(name);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = name;
  }
  if (pcVar2 != (char *)0x0) {
    uVar4 = 0;
    pp_Var3 = __ctype_toupper_loc();
    do {
      _Var1 = (*pp_Var3)[(byte)pcVar2[uVar4]];
      local_218[uVar4] = (char)_Var1;
      if ((char)_Var1 == '\0') goto LAB_001294a9;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 499);
    uVar4 = 499;
LAB_001294a9:
    local_218[uVar4 & 0xffffffff] = '\0';
    pcVar2 = (*xmlMemStrdup)(local_218);
    if (pcVar2 != (char *)0x0) {
      handler = (xmlCharEncodingHandlerPtr)(*xmlMalloc)(0x38);
      if (handler != (xmlCharEncodingHandlerPtr)0x0) {
        handler->name = (char *)0x0;
        (handler->input).func = (xmlCharEncConvFunc)0x0;
        (handler->output).func = (xmlCharEncConvFunc)0x0;
        handler->inputCtxt = (void *)0x0;
        handler->outputCtxt = (void *)0x0;
        handler->ctxtDtor = (xmlCharEncConvCtxtDtor)0x0;
        *(undefined8 *)&handler->flags = 0;
        (handler->input).legacyFunc = input;
        (handler->output).legacyFunc = output;
        handler->name = pcVar2;
        handler->flags = 3;
        xmlRegisterCharEncodingHandler(handler);
        return handler;
      }
      (*xmlFree)(pcVar2);
    }
  }
  return (xmlCharEncodingHandlerPtr)0x0;
}

Assistant:

xmlCharEncodingHandlerPtr
xmlNewCharEncodingHandler(const char *name,
                          xmlCharEncodingInputFunc input,
                          xmlCharEncodingOutputFunc output) {
    xmlCharEncodingHandlerPtr handler;
    const char *alias;
    char upper[500];
    int i;
    char *up = NULL;

    /*
     * Do the alias resolution
     */
    alias = xmlGetEncodingAlias(name);
    if (alias != NULL)
	name = alias;

    /*
     * Keep only the uppercase version of the encoding.
     */
    if (name == NULL)
	return(NULL);
    for (i = 0;i < 499;i++) {
        upper[i] = (char) toupper((unsigned char) name[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;
    up = xmlMemStrdup(upper);
    if (up == NULL)
	return(NULL);

    /*
     * allocate and fill-up an handler block.
     */
    handler = (xmlCharEncodingHandlerPtr)
              xmlMalloc(sizeof(xmlCharEncodingHandler));
    if (handler == NULL) {
        xmlFree(up);
	return(NULL);
    }
    memset(handler, 0, sizeof(xmlCharEncodingHandler));
    handler->input.legacyFunc = input;
    handler->output.legacyFunc = output;
    handler->name = up;
    handler->flags = XML_HANDLER_STATIC | XML_HANDLER_LEGACY;

    /*
     * registers and returns the handler.
     */
    xmlRegisterCharEncodingHandler(handler);
    return(handler);
}